

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypt.cpp
# Opt level: O2

RPCHelpMan * wallet::walletlock(void)

{
  string m_key_name;
  RPCResult result;
  string description;
  string description_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  RPCMethodImpl fun;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffba8;
  undefined8 in_stack_fffffffffffffbb0;
  undefined8 in_stack_fffffffffffffbb8;
  undefined8 in_stack_fffffffffffffbc0;
  _Manager_type in_stack_fffffffffffffbc8;
  undefined8 in_stack_fffffffffffffbd0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffbd8;
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  _Vector_impl_data in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc18 [16];
  pointer pRVar4;
  pointer pRVar5;
  pointer pRVar6;
  undefined1 in_stack_fffffffffffffc40 [24];
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  char *local_138;
  size_type local_130;
  char local_128 [8];
  undefined8 uStack_120;
  string local_118 [32];
  string local_f8 [32];
  RPCResult local_d8;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"walletlock",(allocator<char> *)&stack0xfffffffffffffc47);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,
             "\nRemoves the wallet encryption key from memory, locking the wallet.\nAfter calling this method, you will need to call walletpassphrase again\nbefore being able to call any methods which require the wallet to be unlocked.\n"
             ,(allocator<char> *)&stack0xfffffffffffffc46);
  pRVar4 = (pointer)0x0;
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"",(allocator<char> *)&stack0xfffffffffffffc0f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"",(allocator<char> *)&stack0xfffffffffffffc0e);
  pRVar1 = (pointer)0x0;
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffffbb0;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffba8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffbb8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffbc0;
  description._M_string_length = in_stack_fffffffffffffbd0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbc8;
  description.field_2 = in_stack_fffffffffffffbd8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_d8,NONE,m_key_name,description,inner,SUB81(local_f8,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffbb0;
  result._0_8_ = in_stack_fffffffffffffba8;
  result.m_key_name._M_string_length = in_stack_fffffffffffffbb8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffbc0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffbc8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffbd0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffffbd8;
  result._64_8_ = pRVar1;
  result.m_description._M_dataplus._M_p = (pointer)pRVar2;
  result.m_description._M_string_length = (size_type)pRVar3;
  result._88_24_ = in_stack_fffffffffffffc00;
  result.m_cond._8_16_ = in_stack_fffffffffffffc18;
  result.m_cond.field_2._8_8_ = pRVar4;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffc10,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"walletpassphrase",(allocator<char> *)&stack0xfffffffffffffbe7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"\"my pass phrase\" 120",
             (allocator<char> *)&stack0xfffffffffffffbe6);
  HelpExampleCli(&local_238,&local_258,&local_278);
  std::operator+(&local_218,"\nSet the passphrase for 2 minutes to perform a transaction\n",
                 &local_238);
  std::operator+(&local_1f8,&local_218,"\nPerform a send (requires passphrase set)\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"sendtoaddress",(allocator<char> *)&stack0xfffffffffffffbe5);
  std::operator+(&local_2f8,"\"",EXAMPLE_ADDRESS_abi_cxx11_);
  std::operator+(&local_2d8,&local_2f8,"\" 1.0");
  HelpExampleCli(&local_298,&local_2b8,&local_2d8);
  std::operator+(&local_1d8,&local_1f8,&local_298);
  std::operator+(&local_1b8,&local_1d8,
                 "\nClear the passphrase since we are done before 2 minutes is up\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"walletlock",(allocator<char> *)&stack0xfffffffffffffbe4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"",(allocator<char> *)&stack0xfffffffffffffbe3);
  HelpExampleCli(&local_318,&local_338,&local_358);
  std::operator+(&local_198,&local_1b8,&local_318);
  std::operator+(&local_178,&local_198,"\nAs a JSON-RPC call\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_398,"walletlock",(allocator<char> *)&stack0xfffffffffffffbe2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffc48,"",(allocator<char> *)&stack0xfffffffffffffbe1);
  HelpExampleRpc(&local_378,&local_398,(string *)&stack0xfffffffffffffc48);
  std::operator+(&local_158,&local_178,&local_378);
  local_138 = local_128;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p == &local_158.field_2) {
    uStack_120 = local_158.field_2._8_8_;
  }
  else {
    local_138 = local_158._M_dataplus._M_p;
  }
  local_130 = local_158._M_string_length;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  description_00._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/encrypt.cpp:192:9)>
       ::_M_invoke;
  description_00._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/encrypt.cpp:192:9)>
                ::_M_manager;
  description_00.field_2 = in_stack_fffffffffffffbd8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar1;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar3;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar4;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc18._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffffc18._8_8_;
  examples.m_examples.field_2._8_8_ = pRVar5;
  fun._8_24_ = in_stack_fffffffffffffc40;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar6;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffffbb0,&stack0xfffffffffffffbb8)),
             description_00,args,(RPCResults)in_stack_fffffffffffffc00,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffbb8);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc48);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffc10);
  RPCResult::~RPCResult(&local_d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffbe8);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffc28);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan walletlock()
{
    return RPCHelpMan{"walletlock",
                "\nRemoves the wallet encryption key from memory, locking the wallet.\n"
                "After calling this method, you will need to call walletpassphrase again\n"
                "before being able to call any methods which require the wallet to be unlocked.\n",
                {},
                RPCResult{RPCResult::Type::NONE, "", ""},
                RPCExamples{
            "\nSet the passphrase for 2 minutes to perform a transaction\n"
            + HelpExampleCli("walletpassphrase", "\"my pass phrase\" 120") +
            "\nPerform a send (requires passphrase set)\n"
            + HelpExampleCli("sendtoaddress", "\"" + EXAMPLE_ADDRESS[0] + "\" 1.0") +
            "\nClear the passphrase since we are done before 2 minutes is up\n"
            + HelpExampleCli("walletlock", "") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("walletlock", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    if (!pwallet->IsCrypted()) {
        throw JSONRPCError(RPC_WALLET_WRONG_ENC_STATE, "Error: running with an unencrypted wallet, but walletlock was called.");
    }

    if (pwallet->IsScanningWithPassphrase()) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Error: the wallet is currently being used to rescan the blockchain for related transactions. Please call `abortrescan` before locking the wallet.");
    }

    LOCK2(pwallet->m_relock_mutex, pwallet->cs_wallet);

    pwallet->Lock();
    pwallet->nRelockTime = 0;

    return UniValue::VNULL;
},
    };
}